

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.hpp
# Opt level: O3

VkRenderingAttachmentInfoKHR * __thiscall
VulkanUtilities::RenderingInfoWrapper::GetColorAttachment(RenderingInfoWrapper *this,uint32_t Index)

{
  char (*in_RCX) [34];
  string msg;
  string local_38;
  
  if ((this->m_RI).colorAttachmentCount <= Index) {
    Diligent::FormatString<char[26],char[34]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index < m_RI.colorAttachmentCount",in_RCX);
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetColorAttachment",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/RenderingInfoWrapper.hpp"
               ,0x54);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (this->m_Attachments)._M_t.
         super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl + Index;
}

Assistant:

VkRenderingAttachmentInfoKHR& GetColorAttachment(uint32_t Index)
    {
        VERIFY_EXPR(Index < m_RI.colorAttachmentCount);
        return m_Attachments[Index];
    }